

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTD_freeCCtxContent(ZSTD_CCtx *cctx)

{
  void *ptr;
  
  if (cctx == (ZSTD_CCtx *)0x0) {
    __assert_fail("cctx != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2ad2,"void ZSTD_freeCCtxContent(ZSTD_CCtx *)");
  }
  if (cctx->staticSize == 0) {
    ZSTD_clearAllDicts(cctx);
    ZSTDMT_freeCCtx(cctx->mtctx);
    cctx->mtctx = (ZSTDMT_CCtx *)0x0;
    ptr = (cctx->workspace).workspace;
    (cctx->workspace).tableValidEnd = (void *)0x0;
    (cctx->workspace).allocStart = (void *)0x0;
    (cctx->workspace).allocFailed = 0;
    (cctx->workspace).workspaceOversizedDuration = 0;
    *(undefined8 *)&(cctx->workspace).phase = 0;
    (cctx->workspace).workspace = (void *)0x0;
    (cctx->workspace).workspaceEnd = (void *)0x0;
    (cctx->workspace).objectEnd = (void *)0x0;
    (cctx->workspace).tableEnd = (void *)0x0;
    ZSTD_free(ptr,cctx->customMem);
    return;
  }
  __assert_fail("cctx->staticSize == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x2ad3,"void ZSTD_freeCCtxContent(ZSTD_CCtx *)");
}

Assistant:

static void ZSTD_freeCCtxContent(ZSTD_CCtx* cctx)
{
    assert(cctx != NULL);
    assert(cctx->staticSize == 0);
    ZSTD_clearAllDicts(cctx);
#ifdef ZSTD_MULTITHREAD
    ZSTDMT_freeCCtx(cctx->mtctx); cctx->mtctx = NULL;
#endif
    ZSTD_cwksp_free(&cctx->workspace, cctx->customMem);
}